

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_data_collection_scanner.cpp
# Opt level: O2

void duckdb::RowDataCollectionScanner::AlignHeapBlocks
               (RowDataCollection *swizzled_block_collection,RowDataCollection *swizzled_string_heap
               ,RowDataCollection *block_collection,RowDataCollection *string_heap,RowLayout *layout
               )

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  reference pvVar3;
  pointer pRVar4;
  BlockHandle *pBVar5;
  undefined4 extraout_var;
  data_ptr_t pdVar6;
  unsigned_long base_offset;
  idx_t iVar7;
  ulong base_offset_00;
  pointer this;
  ulong count;
  data_ptr_t pdVar8;
  pair<unsigned_char_*,_unsigned_long> *ptr_and_size;
  idx_t iVar9;
  element_type *peVar10;
  BufferManager *pBVar11;
  vector<std::pair<unsigned_char_*,_unsigned_long>,_true> ptrs_and_sizes;
  unsigned_long size;
  BufferHandle new_heap_handle;
  BufferHandle data_handle;
  MemoryTag local_f1;
  unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *local_f0;
  data_ptr_t local_e8;
  size_type local_e0;
  RowDataBlock local_d8;
  unsigned_long local_a8;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_a0;
  uint local_94;
  vector<duckdb::BufferHandle,_true> *local_90;
  BufferManager *local_88;
  BufferHandle local_80;
  RowDataCollection *local_68;
  RowDataCollection *local_60;
  RowDataCollection *local_58;
  pointer local_50;
  BufferHandle local_48;
  
  if (block_collection->count != 0) {
    local_d8.count = (idx_t)swizzled_string_heap;
    if (layout->all_constant == true) {
      RowDataCollection::Merge(swizzled_block_collection,block_collection);
      return;
    }
    pBVar11 = block_collection->buffer_manager;
    local_a0 = &string_heap->blocks;
    local_e0 = 0;
    local_68 = swizzled_block_collection;
    pvVar3 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::get<true>(local_a0,0);
    pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar3);
    iVar7 = pRVar4->count;
    local_50 = (block_collection->blocks).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_d8.byte_offset = local_d8.count + 0x20;
    local_90 = (vector<duckdb::BufferHandle,_true> *)(local_d8.count + 0x38);
    this = (block_collection->blocks).
           super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_88 = pBVar11;
    local_60 = block_collection;
    local_58 = string_heap;
    while (this != local_50) {
      if (iVar7 == 0) {
        local_e0 = local_e0 + 1;
        pvVar3 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::get<true>(local_a0,local_e0);
        pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(pvVar3);
        iVar7 = pRVar4->count;
      }
      local_f0 = this;
      pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(this);
      (*pBVar11->_vptr_BufferManager[7])(&local_48,pBVar11,pRVar4);
      local_e8 = BufferHandle::Ptr(&local_48);
      if (string_heap->keep_pinned == false) {
        pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(local_f0);
        RowOperations::SwizzleColumns(layout,local_e8,pRVar4->count);
        pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(local_f0);
        pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pRVar4->block);
        pBVar5->unswizzled = (char *)0x0;
      }
      pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(local_f0);
      if (iVar7 < pRVar4->count) {
        if (string_heap->keep_pinned == true) {
          pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(local_f0);
          RowOperations::SwizzleColumns(layout,local_e8,pRVar4->count);
        }
        pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(local_f0);
        iVar9 = pRVar4->count;
        local_d8.capacity = 0;
        local_d8.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_d8.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        base_offset_00 = 0;
        pdVar8 = local_e8;
        for (; pBVar11 = local_88, iVar9 != 0; iVar9 = iVar9 - count) {
          if (iVar7 == 0) {
            local_e0 = local_e0 + 1;
            pvVar3 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                     ::get<true>(local_a0,local_e0);
            pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                     ::operator->(pvVar3);
            iVar7 = pRVar4->count;
          }
          count = iVar7;
          if (iVar9 < iVar7) {
            count = iVar9;
          }
          local_80.handle.internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)(pdVar8 + layout->heap_pointer_offset);
          local_a8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)*(uint **)(pdVar8 + (count - 1) * layout->row_width +
                                                          layout->heap_pointer_offset) +
                                ((ulong)**(uint **)(pdVar8 + (count - 1) * layout->row_width +
                                                             layout->heap_pointer_offset) -
                                (long)local_80.handle.internal.
                                      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr));
          ::std::
          vector<std::pair<unsigned_char*,unsigned_long>,std::allocator<std::pair<unsigned_char*,unsigned_long>>>
          ::emplace_back<unsigned_char*&,unsigned_long&>
                    ((vector<std::pair<unsigned_char*,unsigned_long>,std::allocator<std::pair<unsigned_char*,unsigned_long>>>
                      *)&local_d8,(uchar **)&local_80,&local_a8);
          RowOperations::SwizzleHeapPointer
                    (layout,pdVar8,
                     (data_ptr_t)
                     local_80.handle.internal.
                     super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     count,base_offset_00);
          base_offset_00 = base_offset_00 + local_a8;
          pdVar8 = pdVar8 + layout->row_width * count;
          iVar7 = iVar7 - count;
        }
        local_f1 = ORDER_BY;
        iVar2 = (*local_88->_vptr_BufferManager[0xf])(local_88);
        local_a8 = CONCAT44(extraout_var,iVar2);
        if (CONCAT44(extraout_var,iVar2) < base_offset_00) {
          local_a8 = base_offset_00;
        }
        local_94 = 1;
        make_uniq<duckdb::RowDataBlock,duckdb::MemoryTag,duckdb::BufferManager&,unsigned_long,unsigned_int>
                  ((duckdb *)&local_80,&local_f1,pBVar11,&local_a8,&local_94);
        iVar9 = local_d8.byte_offset;
        ::std::
        vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                    *)local_d8.byte_offset,
                   (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    *)&local_80);
        string_heap = local_58;
        ::std::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>::
        ~unique_ptr((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_> *)
                    &local_80);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::back((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                         *)iVar9);
        pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(pvVar3);
        (*pBVar11->_vptr_BufferManager[7])(&local_80,pBVar11,pRVar4);
        pdVar8 = BufferHandle::Ptr(&local_80);
        _Var1._M_pi = local_d8.block.internal.
                      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        for (peVar10 = local_d8.block.internal.
                       super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            peVar10 != (element_type *)_Var1._M_pi;
            peVar10 = (element_type *)&peVar10->block_manager) {
          switchD_016b45db::default
                    (pdVar8,(peVar10->super_enable_shared_from_this<duckdb::BlockHandle>).
                            __weak_this_.internal.
                            super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,(size_t)(peVar10->super_enable_shared_from_this<duckdb::BlockHandle>).
                              __weak_this_.internal.
                              super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
          pdVar8 = pdVar8 + (long)(peVar10->super_enable_shared_from_this<duckdb::BlockHandle>).
                                  __weak_this_.internal.
                                  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
        }
        pdVar8 = BufferHandle::Ptr(&local_80);
        if (*(bool *)(local_d8.count + 0x50) == true) {
          ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
          emplace_back<duckdb::BufferHandle>
                    (&local_90->
                      super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
                     &local_80);
          pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(local_f0);
          RowOperations::UnswizzlePointers(layout,local_e8,pdVar8,pRVar4->count);
          pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(local_f0);
          RowOperations::UnswizzleHeapPointer(layout,local_e8,pdVar8,pRVar4->count);
        }
        BufferHandle::~BufferHandle(&local_80);
        ::std::
        _Vector_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
        ::~_Vector_base((_Vector_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                         *)&local_d8);
        pBVar11 = local_88;
      }
      else {
        pvVar3 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::get<true>(local_a0,local_e0);
        unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
        operator->(pvVar3);
        RowDataBlock::Copy(&local_d8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                    *)local_d8.byte_offset,
                   (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    *)&local_d8);
        ::std::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>::
        ~unique_ptr((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_> *)
                    &local_d8);
        pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(local_f0);
        iVar9 = pRVar4->count;
        pvVar3 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::back((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                         *)local_d8.byte_offset);
        pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(pvVar3);
        pRVar4->count = iVar9;
        pvVar3 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::back((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                         *)local_d8.byte_offset);
        pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(pvVar3);
        (*pBVar11->_vptr_BufferManager[7])(&local_d8,pBVar11,pRVar4);
        if (*(bool *)(local_d8.count + 0x50) == false) {
          pdVar8 = *(data_ptr_t *)(local_e8 + layout->heap_pointer_offset);
          pdVar6 = BufferHandle::Ptr((BufferHandle *)&local_d8);
          pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(local_f0);
          iVar9 = pRVar4->count;
          base_offset = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                  ((long)pdVar8 - (long)pdVar6);
          RowOperations::SwizzleHeapPointer(layout,local_e8,pdVar8,iVar9,base_offset);
        }
        else {
          ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
          emplace_back<duckdb::BufferHandle>
                    (&local_90->
                      super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
                     (BufferHandle *)&local_d8);
        }
        pRVar4 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(local_f0);
        iVar7 = iVar7 - pRVar4->count;
        BufferHandle::~BufferHandle((BufferHandle *)&local_d8);
      }
      BufferHandle::~BufferHandle(&local_48);
      this = local_f0 + 1;
    }
    RowDataCollection::Merge(local_68,local_60);
    *(idx_t *)(local_d8.count + 8) = string_heap->count;
    RowDataCollection::Clear(string_heap);
  }
  return;
}

Assistant:

void RowDataCollectionScanner::AlignHeapBlocks(RowDataCollection &swizzled_block_collection,
                                               RowDataCollection &swizzled_string_heap,
                                               RowDataCollection &block_collection, RowDataCollection &string_heap,
                                               const RowLayout &layout) {
	if (block_collection.count == 0) {
		return;
	}

	if (layout.AllConstant()) {
		// No heap blocks! Just merge fixed-size data
		swizzled_block_collection.Merge(block_collection);
		return;
	}

	// We create one heap block per data block and swizzle the pointers
	D_ASSERT(string_heap.keep_pinned == swizzled_string_heap.keep_pinned);
	auto &buffer_manager = block_collection.buffer_manager;
	auto &heap_blocks = string_heap.blocks;
	idx_t heap_block_idx = 0;
	idx_t heap_block_remaining = heap_blocks[heap_block_idx]->count;
	for (auto &data_block : block_collection.blocks) {
		if (heap_block_remaining == 0) {
			heap_block_remaining = heap_blocks[++heap_block_idx]->count;
		}

		// Pin the data block and swizzle the pointers within the rows
		auto data_handle = buffer_manager.Pin(data_block->block);
		auto data_ptr = data_handle.Ptr();
		if (!string_heap.keep_pinned) {
			D_ASSERT(!data_block->block->IsSwizzled());
			RowOperations::SwizzleColumns(layout, data_ptr, data_block->count);
			data_block->block->SetSwizzling(nullptr);
		}
		// At this point the data block is pinned and the heap pointer is valid
		// so we can copy heap data as needed

		// We want to copy as little of the heap data as possible, check how the data and heap blocks line up
		if (heap_block_remaining >= data_block->count) {
			// Easy: current heap block contains all strings for this data block, just copy (reference) the block
			swizzled_string_heap.blocks.emplace_back(heap_blocks[heap_block_idx]->Copy());
			swizzled_string_heap.blocks.back()->count = data_block->count;

			// Swizzle the heap pointer if we are not pinning the heap
			auto &heap_block = swizzled_string_heap.blocks.back()->block;
			auto heap_handle = buffer_manager.Pin(heap_block);
			if (!swizzled_string_heap.keep_pinned) {
				auto heap_ptr = Load<data_ptr_t>(data_ptr + layout.GetHeapOffset());
				auto heap_offset = heap_ptr - heap_handle.Ptr();
				RowOperations::SwizzleHeapPointer(layout, data_ptr, heap_ptr, data_block->count,
				                                  NumericCast<idx_t>(heap_offset));
			} else {
				swizzled_string_heap.pinned_blocks.emplace_back(std::move(heap_handle));
			}

			// Update counter
			heap_block_remaining -= data_block->count;
		} else {
			// Strings for this data block are spread over the current heap block and the next (and possibly more)
			if (string_heap.keep_pinned) {
				// The heap is changing underneath the data block,
				// so swizzle the string pointers to make them portable.
				RowOperations::SwizzleColumns(layout, data_ptr, data_block->count);
			}
			idx_t data_block_remaining = data_block->count;
			vector<std::pair<data_ptr_t, idx_t>> ptrs_and_sizes;
			idx_t total_size = 0;
			const auto base_row_ptr = data_ptr;
			while (data_block_remaining > 0) {
				if (heap_block_remaining == 0) {
					heap_block_remaining = heap_blocks[++heap_block_idx]->count;
				}
				auto next = MinValue<idx_t>(data_block_remaining, heap_block_remaining);

				// Figure out where to start copying strings, and how many bytes we need to copy
				auto heap_start_ptr = Load<data_ptr_t>(data_ptr + layout.GetHeapOffset());
				auto heap_end_ptr =
				    Load<data_ptr_t>(data_ptr + layout.GetHeapOffset() + (next - 1) * layout.GetRowWidth());
				auto size = NumericCast<idx_t>(heap_end_ptr - heap_start_ptr + Load<uint32_t>(heap_end_ptr));
				ptrs_and_sizes.emplace_back(heap_start_ptr, size);
				D_ASSERT(size <= heap_blocks[heap_block_idx]->byte_offset);

				// Swizzle the heap pointer
				RowOperations::SwizzleHeapPointer(layout, data_ptr, heap_start_ptr, next, total_size);
				total_size += size;

				// Update where we are in the data and heap blocks
				data_ptr += next * layout.GetRowWidth();
				data_block_remaining -= next;
				heap_block_remaining -= next;
			}

			// Finally, we allocate a new heap block and copy data to it
			swizzled_string_heap.blocks.emplace_back(make_uniq<RowDataBlock>(
			    MemoryTag::ORDER_BY, buffer_manager, MaxValue<idx_t>(total_size, buffer_manager.GetBlockSize()), 1U));
			auto new_heap_handle = buffer_manager.Pin(swizzled_string_heap.blocks.back()->block);
			auto new_heap_ptr = new_heap_handle.Ptr();
			for (auto &ptr_and_size : ptrs_and_sizes) {
				memcpy(new_heap_ptr, ptr_and_size.first, ptr_and_size.second);
				new_heap_ptr += ptr_and_size.second;
			}
			new_heap_ptr = new_heap_handle.Ptr();
			if (swizzled_string_heap.keep_pinned) {
				// Since the heap blocks are pinned, we can unswizzle the data again.
				swizzled_string_heap.pinned_blocks.emplace_back(std::move(new_heap_handle));
				RowOperations::UnswizzlePointers(layout, base_row_ptr, new_heap_ptr, data_block->count);
				RowOperations::UnswizzleHeapPointer(layout, base_row_ptr, new_heap_ptr, data_block->count);
			}
		}
	}

	// We're done with variable-sized data, now just merge the fixed-size data
	swizzled_block_collection.Merge(block_collection);
	D_ASSERT(swizzled_block_collection.blocks.size() == swizzled_string_heap.blocks.size());

	// Update counts and cleanup
	swizzled_string_heap.count = string_heap.count;
	string_heap.Clear();
}